

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * pack19_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x80000 | uVar1 - base;
  uVar2 = in[1] - base >> 0xd;
  out[1] = uVar2;
  uVar2 = (in[2] - base) * 0x40 | uVar2;
  out[1] = uVar2;
  out[1] = (in[3] - base) * 0x2000000 | uVar2;
  uVar2 = in[3] - base >> 7;
  out[2] = uVar2;
  uVar2 = (in[4] - base) * 0x1000 | uVar2;
  out[2] = uVar2;
  out[2] = (in[5] - base) * -0x80000000 | uVar2;
  uVar2 = in[5] - base >> 1;
  out[3] = uVar2;
  out[3] = (in[6] - base) * 0x40000 | uVar2;
  uVar2 = in[6] - base >> 0xe;
  out[4] = uVar2;
  out[4] = (in[7] - base) * 0x20 | uVar2;
  return out + 5;
}

Assistant:

uint32_t * pack19_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  6 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  25 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  18 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  18 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 19  -  5 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  5 ;
    ++in;

    return out + 1;
}